

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char_int_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
::get(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>_>
      *this)

{
  size_t *psVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  char local_9;
  
  (this->position).chars_read_total = (this->position).chars_read_total + 1;
  (this->position).chars_read_current_line = (this->position).chars_read_current_line + 1;
  if (this->next_unget == true) {
    this->next_unget = false;
    uVar3 = this->current;
  }
  else {
    pbVar2 = (byte *)(this->ia).current;
    if (pbVar2 == (byte *)(this->ia).end) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = (uint)*pbVar2;
      (this->ia).current = (char *)(pbVar2 + 1);
    }
    this->current = uVar3;
  }
  if (uVar3 == 0xffffffff) {
    iVar4 = -1;
  }
  else {
    local_9 = (char)uVar3;
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->token_string,&local_9);
    iVar4 = this->current;
    if (iVar4 == 10) {
      psVar1 = &(this->position).lines_read;
      *psVar1 = *psVar1 + 1;
      (this->position).chars_read_current_line = 0;
      iVar4 = 10;
    }
  }
  return iVar4;
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }